

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_definition.c
# Opt level: O0

bool_t prf_instance_definition_load_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  uint16_t uVar1;
  int16_t iVar2;
  void *pvVar3;
  bfile_t *in_RDX;
  long *in_RSI;
  ushort *in_RDI;
  bfile_t *unaff_retaddr;
  uint32_t pos;
  node_data_conflict4 *data;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar4;
  undefined8 in_stack_ffffffffffffffd8;
  uint n_bytes;
  int16_t *piVar5;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  bool_t bVar6;
  
  n_bytes = (uint)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  iVar4 = 4;
  uVar1 = bf_get_uint16_be((bfile_t *)CONCAT44(4,in_stack_ffffffffffffffd0));
  *in_RDI = uVar1;
  if (*in_RDI == prf_instance_definition_info.opcode) {
    uVar1 = bf_get_uint16_be((bfile_t *)CONCAT44(iVar4,in_stack_ffffffffffffffd0));
    in_RDI[1] = uVar1;
    if ((*(long *)(in_RDI + 4) == 0) && (4 < in_RDI[1])) {
      if (*(short *)(*in_RSI + 8) == 0) {
        pvVar3 = malloc((long)(int)(in_RDI[1] - 4));
        *(void **)(in_RDI + 4) = pvVar3;
      }
      else {
        pvVar3 = pool_malloc((pool_t)((ulong)in_RSI >> 0x30),(int)in_RSI);
        *(void **)(in_RDI + 4) = pvVar3;
      }
      if (*(long *)(in_RDI + 4) == 0) {
        prf_error(9,"memory allocation problem (returned NULL)");
        bf_rewind(in_RDX,n_bytes);
        return 0;
      }
    }
    piVar5 = *(int16_t **)(in_RDI + 4);
    iVar2 = bf_get_int16_be((bfile_t *)CONCAT44(iVar4,in_stack_ffffffffffffffd0));
    *piVar5 = iVar2;
    iVar4 = iVar4 + 2;
    iVar2 = bf_get_int16_be((bfile_t *)CONCAT44(iVar4,in_stack_ffffffffffffffd0));
    piVar5[1] = iVar2;
    if (iVar4 + 2U < (uint)in_RDI[1]) {
      bf_read(unaff_retaddr,(uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
              ,(uint)((ulong)in_RDI >> 0x20));
    }
    bVar6 = 1;
  }
  else {
    prf_error(9,"tried instance definition load method for node of type %d.",(ulong)*in_RDI);
    bf_rewind(in_RDX,n_bytes);
    bVar6 = 0;
  }
  return bVar6;
}

Assistant:

static bool_t
prf_instance_definition_load_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    node_data * data;
    uint32_t pos = 4;

    assert( node != NULL && state != NULL && bfile != NULL );

    node->opcode = bf_get_uint16_be( bfile );
    if ( node->opcode != prf_instance_definition_info.opcode ) {
        prf_error( 9, "tried instance definition load method for "
                   "node of type %d.", node->opcode );
        bf_rewind( bfile, 2 );
        return FALSE;
    }

    node->length = bf_get_uint16_be( bfile );
    assert(node->length >= 8);

    if ( node->data == NULL && node->length > 4 ) {
        assert( state->model != NULL );
        if ( state->model->mempool_id == 0 )
            node->data = (uint8_t *) malloc( node->length - 4);
        else
            node->data = (uint8_t *) pool_malloc( state->model->mempool_id,
                                                  node->length - 4 );
        if ( node->data == NULL ) {
            prf_error( 9, "memory allocation problem (returned NULL)" );
            bf_rewind( bfile, 4 );
            return FALSE;
        }
    }


    data = (node_data *) node->data;
    data->spare = bf_get_int16_be( bfile ); pos += 2;
    data->instance_definition_number = bf_get_int16_be( bfile ); pos += 2;

    if ( pos < node->length ) /* padding */
        pos += bf_read( bfile, node->data + pos - 4, node->length - pos );
    return TRUE;
}